

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_copySequencesToSeqStoreNoBlockDelim
                 (ZSTD_CCtx *cctx,ZSTD_sequencePosition *seqPos,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t blockSize)

{
  undefined4 rawOffset_00;
  ZSTD_compressedBlockState_t *pZVar1;
  undefined4 uVar3;
  BYTE *pBVar2;
  bool bVar4;
  bool bVar5;
  U32 offset;
  uint uVar6;
  ZSTD_Sequence *pZVar7;
  size_t code;
  BYTE *dst;
  ulong uVar8;
  repcodes_t rVar9;
  U32 local_15c;
  U32 lastLLSize;
  size_t err_code;
  U32 local_140;
  U32 ll0;
  U32 secondHalfMatchLength;
  U32 firstHalfMatchLength;
  ZSTD_Sequence currSeq;
  U32 offCode;
  U32 rawOffset;
  U32 matchLength;
  U32 litLength;
  U32 finalMatchSplit;
  U32 bytesAdjustment;
  repcodes_t updatedRepcodes;
  BYTE *iend;
  BYTE *ip;
  size_t dictSize;
  uint local_c8;
  U32 endPosInSequence;
  U32 startPosInSequence;
  U32 idx;
  size_t blockSize_local;
  void *src_local;
  size_t inSeqsSize_local;
  ZSTD_Sequence *inSeqs_local;
  ZSTD_sequencePosition *seqPos_local;
  ZSTD_CCtx *cctx_local;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_1;
  ptrdiff_t diff;
  
  endPosInSequence = seqPos->idx;
  local_c8 = seqPos->posInSequence;
  dictSize._4_4_ = seqPos->posInSequence + (int)blockSize;
  updatedRepcodes.rep._4_8_ = (long)src + blockSize;
  litLength = 0;
  bVar4 = false;
  if (cctx->cdict == (ZSTD_CDict *)0x0) {
    if ((cctx->prefixDict).dict == (void *)0x0) {
      ip = (BYTE *)0x0;
    }
    else {
      ip = (BYTE *)(cctx->prefixDict).dictSize;
    }
  }
  else {
    ip = (BYTE *)cctx->cdict->dictContentSize;
  }
  pZVar1 = (cctx->blockState).prevCBlock;
  _finalMatchSplit = *(size_t *)pZVar1->rep;
  updatedRepcodes.rep[0] = pZVar1->rep[2];
  iend = (BYTE *)src;
  do {
    bVar5 = false;
    if ((dictSize._4_4_ != 0) && (bVar5 = false, endPosInSequence < inSeqsSize)) {
      bVar5 = !bVar4;
    }
    if (!bVar5) goto LAB_0024ac6d;
    pZVar7 = inSeqs + endPosInSequence;
    rawOffset_00 = pZVar7->offset;
    uVar3 = pZVar7->litLength;
    uVar8._0_4_ = pZVar7->matchLength;
    uVar8._4_4_ = pZVar7->rep;
    offCode = (undefined4)uVar8;
    if (dictSize._4_4_ < (uint)(uVar3 + (undefined4)uVar8)) {
      if (dictSize._4_4_ <= (uint)uVar3) {
LAB_0024ac6d:
        seqPos->idx = endPosInSequence;
        seqPos->posInSequence = dictSize._4_4_;
        pZVar1 = (cctx->blockState).nextCBlock;
        *(size_t *)pZVar1->rep = _finalMatchSplit;
        pZVar1->rep[2] = updatedRepcodes.rep[0];
        updatedRepcodes.rep._4_8_ = updatedRepcodes.rep._4_8_ - (ulong)litLength;
        if (iend != (BYTE *)updatedRepcodes.rep._4_8_) {
          uVar6 = (int)updatedRepcodes.rep._4_8_ - (int)iend;
          ZSTD_storeLastLiterals(&cctx->seqStore,iend,(ulong)uVar6);
          seqPos->posInSrc = (ulong)uVar6 + seqPos->posInSrc;
        }
        return (ulong)litLength;
      }
      if (local_c8 < (uint)uVar3) {
        local_15c = uVar3 - local_c8;
      }
      else {
        local_15c = 0;
      }
      rawOffset = local_15c;
      ll0 = (dictSize._4_4_ - local_c8) - local_15c;
      if (((uVar8 & 0xffffffff) <= blockSize) || (ll0 < (cctx->appliedParams).cParams.minMatch)) {
        litLength = dictSize._4_4_ - uVar3;
        dictSize._4_4_ = uVar3;
        goto LAB_0024ac6d;
      }
      uVar6 = ((undefined4)uVar8 + uVar3) - dictSize._4_4_;
      if (uVar6 < (cctx->appliedParams).cParams.minMatch) {
        dictSize._4_4_ = dictSize._4_4_ - ((cctx->appliedParams).cParams.minMatch - uVar6);
        litLength = (cctx->appliedParams).cParams.minMatch - uVar6;
        ll0 = ll0 - litLength;
      }
      offCode = ll0;
      bVar4 = true;
    }
    else {
      if (local_c8 < (uint)uVar3) {
        rawOffset = uVar3 - local_c8;
      }
      else {
        rawOffset = 0;
        offCode = (undefined4)uVar8 - (local_c8 - uVar3);
      }
      dictSize._4_4_ = dictSize._4_4_ - (uVar3 + (undefined4)uVar8);
      local_c8 = 0;
      endPosInSequence = endPosInSequence + 1;
    }
    offset = ZSTD_finalizeOffCode(rawOffset_00,&finalMatchSplit,(uint)(rawOffset == 0));
    rVar9 = ZSTD_updateRep(&finalMatchSplit,offset,(uint)(rawOffset == 0));
    err_code = rVar9.rep._0_8_;
    local_140 = rVar9.rep[2];
    _finalMatchSplit = err_code;
    updatedRepcodes.rep[0] = local_140;
    if ((cctx->appliedParams).validateSequences != 0) {
      seqPos->posInSrc = (ulong)(rawOffset + offCode) + seqPos->posInSrc;
      code = ZSTD_validateSequence
                       (offset,offCode,seqPos->posInSrc,(cctx->appliedParams).cParams.windowLog,
                        (size_t)ip,(cctx->appliedParams).cParams.minMatch);
      uVar6 = ERR_isError(code);
      if (uVar6 != 0) {
        return code;
      }
    }
    if ((cctx->seqStore).maxNbSeq < (ulong)(endPosInSequence - seqPos->idx)) {
      return 0xffffffffffffffc0;
    }
    uVar8 = (ulong)rawOffset;
    if ((BYTE *)(updatedRepcodes.rep._4_8_ + -0x20) < iend + uVar8) {
      ZSTD_safecopyLiterals
                ((cctx->seqStore).lit,iend,iend + uVar8,(BYTE *)(updatedRepcodes.rep._4_8_ + -0x20))
      ;
    }
    else {
      ZSTD_copy16((cctx->seqStore).lit,iend);
      if (0x10 < uVar8) {
        pBVar2 = (cctx->seqStore).lit;
        dst = pBVar2 + 0x10;
        ZSTD_copy16(dst,iend + 0x10);
        if (0x10 < (long)(uVar8 - 0x10)) {
          oend = pBVar2 + 0x20;
          pBVar2 = iend;
          do {
            op = pBVar2 + 0x20;
            ZSTD_copy16(oend,op);
            ZSTD_copy16(oend + 0x10,pBVar2 + 0x30);
            oend = oend + 0x20;
            pBVar2 = op;
          } while (oend < dst + (uVar8 - 0x10));
        }
      }
    }
    (cctx->seqStore).lit = (cctx->seqStore).lit + uVar8;
    if (0xffff < uVar8) {
      (cctx->seqStore).longLengthType = ZSTD_llt_literalLength;
      (cctx->seqStore).longLengthPos =
           (U32)((long)(cctx->seqStore).sequences - (long)(cctx->seqStore).sequencesStart >> 3);
    }
    ((cctx->seqStore).sequences)->litLength = (U16)rawOffset;
    ((cctx->seqStore).sequences)->offset = offset + 1;
    if (0xffff < offCode - 3) {
      (cctx->seqStore).longLengthType = ZSTD_llt_matchLength;
      (cctx->seqStore).longLengthPos =
           (U32)((long)(cctx->seqStore).sequences - (long)(cctx->seqStore).sequencesStart >> 3);
    }
    ((cctx->seqStore).sequences)->matchLength = (U16)(offCode - 3);
    (cctx->seqStore).sequences = (cctx->seqStore).sequences + 1;
    iend = iend + (offCode + rawOffset);
  } while( true );
}

Assistant:

static size_t ZSTD_copySequencesToSeqStoreNoBlockDelim(ZSTD_CCtx* cctx, ZSTD_sequencePosition* seqPos,
                                                       const ZSTD_Sequence* const inSeqs, size_t inSeqsSize,
                                                       const void* src, size_t blockSize) {
    U32 idx = seqPos->idx;
    U32 startPosInSequence = seqPos->posInSequence;
    U32 endPosInSequence = seqPos->posInSequence + (U32)blockSize;
    size_t dictSize;
    BYTE const* ip = (BYTE const*)(src);
    BYTE const* iend = ip + blockSize;  /* May be adjusted if we decide to process fewer than blockSize bytes */
    repcodes_t updatedRepcodes;
    U32 bytesAdjustment = 0;
    U32 finalMatchSplit = 0;
    U32 litLength;
    U32 matchLength;
    U32 rawOffset;
    U32 offCode;

    if (cctx->cdict) {
        dictSize = cctx->cdict->dictContentSize;
    } else if (cctx->prefixDict.dict) {
        dictSize = cctx->prefixDict.dictSize;
    } else {
        dictSize = 0;
    }
    DEBUGLOG(5, "ZSTD_copySequencesToSeqStore: idx: %u PIS: %u blockSize: %zu", idx, startPosInSequence, blockSize);
    DEBUGLOG(5, "Start seq: idx: %u (of: %u ml: %u ll: %u)", idx, inSeqs[idx].offset, inSeqs[idx].matchLength, inSeqs[idx].litLength);
    ZSTD_memcpy(updatedRepcodes.rep, cctx->blockState.prevCBlock->rep, sizeof(repcodes_t));
    while (endPosInSequence && idx < inSeqsSize && !finalMatchSplit) {
        const ZSTD_Sequence currSeq = inSeqs[idx];
        litLength = currSeq.litLength;
        matchLength = currSeq.matchLength;
        rawOffset = currSeq.offset;

        /* Modify the sequence depending on where endPosInSequence lies */
        if (endPosInSequence >= currSeq.litLength + currSeq.matchLength) {
            if (startPosInSequence >= litLength) {
                startPosInSequence -= litLength;
                litLength = 0;
                matchLength -= startPosInSequence;
            } else {
                litLength -= startPosInSequence;
            }
            /* Move to the next sequence */
            endPosInSequence -= currSeq.litLength + currSeq.matchLength;
            startPosInSequence = 0;
            idx++;
        } else {
            /* This is the final (partial) sequence we're adding from inSeqs, and endPosInSequence
               does not reach the end of the match. So, we have to split the sequence */
            DEBUGLOG(6, "Require a split: diff: %u, idx: %u PIS: %u",
                     currSeq.litLength + currSeq.matchLength - endPosInSequence, idx, endPosInSequence);
            if (endPosInSequence > litLength) {
                U32 firstHalfMatchLength;
                litLength = startPosInSequence >= litLength ? 0 : litLength - startPosInSequence;
                firstHalfMatchLength = endPosInSequence - startPosInSequence - litLength;
                if (matchLength > blockSize && firstHalfMatchLength >= cctx->appliedParams.cParams.minMatch) {
                    /* Only ever split the match if it is larger than the block size */
                    U32 secondHalfMatchLength = currSeq.matchLength + currSeq.litLength - endPosInSequence;
                    if (secondHalfMatchLength < cctx->appliedParams.cParams.minMatch) {
                        /* Move the endPosInSequence backward so that it creates match of minMatch length */
                        endPosInSequence -= cctx->appliedParams.cParams.minMatch - secondHalfMatchLength;
                        bytesAdjustment = cctx->appliedParams.cParams.minMatch - secondHalfMatchLength;
                        firstHalfMatchLength -= bytesAdjustment;
                    }
                    matchLength = firstHalfMatchLength;
                    /* Flag that we split the last match - after storing the sequence, exit the loop,
                       but keep the value of endPosInSequence */
                    finalMatchSplit = 1;
                } else {
                    /* Move the position in sequence backwards so that we don't split match, and break to store
                     * the last literals. We use the original currSeq.litLength as a marker for where endPosInSequence
                     * should go. We prefer to do this whenever it is not necessary to split the match, or if doing so
                     * would cause the first half of the match to be too small
                     */
                    bytesAdjustment = endPosInSequence - currSeq.litLength;
                    endPosInSequence = currSeq.litLength;
                    break;
                }
            } else {
                /* This sequence ends inside the literals, break to store the last literals */
                break;
            }
        }
        /* Check if this offset can be represented with a repcode */
        {   U32 ll0 = (litLength == 0);
            offCode = ZSTD_finalizeOffCode(rawOffset, updatedRepcodes.rep, ll0);
            updatedRepcodes = ZSTD_updateRep(updatedRepcodes.rep, offCode, ll0);
        }

        if (cctx->appliedParams.validateSequences) {
            seqPos->posInSrc += litLength + matchLength;
            FORWARD_IF_ERROR(ZSTD_validateSequence(offCode, matchLength, seqPos->posInSrc,
                                                   cctx->appliedParams.cParams.windowLog, dictSize,
                                                   cctx->appliedParams.cParams.minMatch),
                                                   "Sequence validation failed");
        }
        DEBUGLOG(6, "Storing sequence: (of: %u, ml: %u, ll: %u)", offCode, matchLength, litLength);
        RETURN_ERROR_IF(idx - seqPos->idx > cctx->seqStore.maxNbSeq, memory_allocation,
                        "Not enough memory allocated. Try adjusting ZSTD_c_minMatch.");
        ZSTD_storeSeq(&cctx->seqStore, litLength, ip, iend, offCode, matchLength - MINMATCH);
        ip += matchLength + litLength;
    }
    DEBUGLOG(5, "Ending seq: idx: %u (of: %u ml: %u ll: %u)", idx, inSeqs[idx].offset, inSeqs[idx].matchLength, inSeqs[idx].litLength);
    assert(idx == inSeqsSize || endPosInSequence <= inSeqs[idx].litLength + inSeqs[idx].matchLength);
    seqPos->idx = idx;
    seqPos->posInSequence = endPosInSequence;
    ZSTD_memcpy(cctx->blockState.nextCBlock->rep, updatedRepcodes.rep, sizeof(repcodes_t));

    iend -= bytesAdjustment;
    if (ip != iend) {
        /* Store any last literals */
        U32 lastLLSize = (U32)(iend - ip);
        assert(ip <= iend);
        DEBUGLOG(6, "Storing last literals of size: %u", lastLLSize);
        ZSTD_storeLastLiterals(&cctx->seqStore, ip, lastLLSize);
        seqPos->posInSrc += lastLLSize;
    }

    return bytesAdjustment;
}